

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_cf_rawequal(lua_State *L)

{
  uint uVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  undefined4 uVar4;
  int narg;
  
  pTVar2 = L->base;
  pTVar3 = L->top;
  if (pTVar3 <= pTVar2) {
    narg = 1;
LAB_00141a7e:
    lj_err_arg(L,narg,LJ_ERR_NOVAL);
  }
  if (pTVar3 <= pTVar2 + 1) {
    narg = 2;
    goto LAB_00141a7e;
  }
  uVar1 = (pTVar2->field_2).it;
  if (uVar1 == *(uint *)((long)pTVar2 + 0xc)) {
    if (uVar1 < 0xfffffffd) {
      if (uVar1 < 0xfffeffff) goto LAB_00141a51;
      uVar4 = 0xfffffffe;
      if ((pTVar2->u32).lo != pTVar2[1].u32.lo) goto LAB_00141a68;
    }
  }
  else {
    uVar4 = 0xfffffffe;
    if (0xfffeffff < *(uint *)((long)pTVar2 + 0xc) || 0xfffeffff < uVar1) goto LAB_00141a68;
LAB_00141a51:
    uVar4 = 0xfffffffe;
    if ((pTVar2->n != pTVar2[1].n) || (NAN(pTVar2->n) || NAN(pTVar2[1].n))) goto LAB_00141a68;
  }
  uVar4 = 0xfffffffd;
LAB_00141a68:
  *(undefined4 *)((long)pTVar3 + -4) = uVar4;
  return 1;
}

Assistant:

LJLIB_CF(rawequal)		LJLIB_REC(.)
{
  cTValue *o1 = lj_lib_checkany(L, 1);
  cTValue *o2 = lj_lib_checkany(L, 2);
  setboolV(L->top-1, lj_obj_equal(o1, o2));
  return 1;
}